

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Token slang::parsing::Token::createMissing
                (BumpAllocator *alloc,TokenKind kind,SourceLocation location)

{
  SourceLocation location_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  SourceLocation location_05;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_01;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_02;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_03;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_04;
  string_view rawText;
  SourceLocation location_06;
  SourceLocation location_07;
  SourceLocation location_08;
  string_view rawText_00;
  string_view rawText_01;
  string_view rawText_02;
  string_view rawText_03;
  string_view rawText_04;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_05;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_06;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_07;
  string_view strText;
  string_view rawText_05;
  string_view rawText_06;
  string_view rawText_07;
  Token TVar1;
  ulong uVar2;
  undefined8 in_RDX;
  short in_SI;
  BumpAllocator *in_RDI;
  Token result;
  TimeUnit *in_stack_fffffffffffffd08;
  Token *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd48;
  undefined6 in_stack_fffffffffffffd50;
  TokenKind in_stack_fffffffffffffd56;
  Token *in_stack_fffffffffffffd58;
  TokenKind TVar3;
  undefined6 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffd67;
  undefined1 uVar5;
  undefined7 in_stack_fffffffffffffd68;
  undefined7 uVar6;
  logic_t in_stack_fffffffffffffd6f;
  undefined6 in_stack_fffffffffffffd70;
  TokenKind in_stack_fffffffffffffd76;
  undefined6 in_stack_fffffffffffffd78;
  undefined2 in_stack_fffffffffffffd7e;
  TokenKind kind_00;
  undefined6 in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd86;
  undefined6 in_stack_fffffffffffffd88;
  _Optional_payload_base<slang::TimeUnit> in_stack_fffffffffffffd8e;
  undefined6 in_stack_fffffffffffffd90;
  undefined2 in_stack_fffffffffffffd96;
  char *in_stack_fffffffffffffd98;
  LiteralBase base;
  KnownSystemName in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  undefined2 in_stack_fffffffffffffda6;
  undefined4 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb4;
  short sVar7;
  char *in_stack_fffffffffffffdb8;
  SVInt *in_stack_fffffffffffffdc0;
  undefined8 local_220;
  Info *local_218;
  undefined8 local_1e0;
  Info *local_1d8;
  optional<slang::TimeUnit> local_1ca;
  undefined8 local_1c8;
  undefined8 local_1a0;
  Info *local_198;
  undefined1 local_189;
  undefined8 local_188;
  undefined8 local_160;
  Info *local_158;
  undefined8 local_150;
  undefined8 local_128;
  Info *local_120;
  undefined8 local_118;
  undefined8 local_f0;
  Info *local_e8;
  undefined8 local_e0;
  undefined8 local_b8;
  Info *local_b0;
  undefined8 local_a8;
  undefined8 local_80;
  Info *local_78;
  undefined8 local_60;
  undefined8 local_38;
  Info *local_30;
  short local_22;
  BumpAllocator *local_20;
  undefined8 local_18;
  undefined2 local_10;
  undefined1 uStack_e;
  undefined5 uStack_d;
  Info *local_8;
  
  TVar3 = (TokenKind)((ulong)in_stack_fffffffffffffd48 >> 0x30);
  local_22 = in_SI;
  local_20 = in_RDI;
  local_18 = in_RDX;
  Token(in_stack_fffffffffffffd10);
  kind_00 = (TokenKind)((ulong)local_20 >> 0x30);
  if (local_22 == 3) {
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x5481eb);
    TVar3 = (TokenKind)((ulong)in_stack_fffffffffffffd58 >> 0x30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_e0 = local_18;
    trivia_02._M_ptr._6_2_ = in_stack_fffffffffffffd7e;
    trivia_02._M_ptr._0_6_ = in_stack_fffffffffffffd78;
    trivia_02._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffd80;
    trivia_02._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffd86;
    rawText_02._M_len._6_2_ = local_22;
    rawText_02._M_len._0_6_ = in_stack_fffffffffffffd90;
    rawText_02._M_str = in_stack_fffffffffffffd98;
    location_03._6_2_ = in_stack_fffffffffffffd76;
    location_03._0_6_ = in_stack_fffffffffffffd70;
    Token((Token *)CONCAT17(in_stack_fffffffffffffd6f.value,in_stack_fffffffffffffd68),
          (BumpAllocator *)
          CONCAT17(in_stack_fffffffffffffd67,
                   CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),TVar3,trivia_02,
          rawText_02,location_03,in_stack_fffffffffffffda0);
    local_10 = (undefined2)local_b8;
    uStack_e = (undefined1)((ulong)local_b8 >> 0x10);
    uStack_d = (undefined5)((ulong)local_b8 >> 0x18);
    local_8 = local_b0;
    goto LAB_0054877f;
  }
  if (local_22 == 4) {
LAB_00547ffa:
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x548027);
    TVar3 = (TokenKind)((ulong)in_stack_fffffffffffffd58 >> 0x30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_60 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    trivia_00._M_ptr._6_2_ = in_stack_fffffffffffffd7e;
    trivia_00._M_ptr._0_6_ = in_stack_fffffffffffffd78;
    trivia_00._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffd80;
    trivia_00._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffd86;
    rawText_00._M_len._6_2_ = in_stack_fffffffffffffd96;
    rawText_00._M_len._0_6_ = in_stack_fffffffffffffd90;
    rawText_00._M_str = in_stack_fffffffffffffd98;
    location_01._6_2_ = in_stack_fffffffffffffd76;
    location_01._0_6_ = in_stack_fffffffffffffd70;
    strText._M_len._4_2_ = in_stack_fffffffffffffda4;
    strText._M_len._0_4_ = in_stack_fffffffffffffda0;
    strText._M_len._6_2_ = in_stack_fffffffffffffda6;
    strText._M_str = (char *)local_20;
    Token((Token *)CONCAT17(in_stack_fffffffffffffd6f.value,in_stack_fffffffffffffd68),
          (BumpAllocator *)
          CONCAT17(in_stack_fffffffffffffd67,
                   CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),TVar3,trivia_00,
          rawText_00,location_01,strText);
    local_10 = (undefined2)local_38;
    uStack_e = (undefined1)((ulong)local_38 >> 0x10);
    uStack_d = (undefined5)((ulong)local_38 >> 0x18);
    local_8 = local_30;
  }
  else {
    if (local_22 == 5) {
      sVar7 = local_22;
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x5482b6);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      local_118 = local_18;
      trivia_05._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffda0;
      trivia_05._M_ptr = (pointer)in_stack_fffffffffffffd98;
      trivia_05._M_extent._M_extent_value._4_2_ = in_stack_fffffffffffffda4;
      trivia_05._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffda6;
      rawText_05._M_len._4_2_ = in_stack_fffffffffffffdb4;
      rawText_05._M_len._0_4_ = in_stack_fffffffffffffdb0;
      rawText_05._M_len._6_2_ = sVar7;
      rawText_05._M_str = in_stack_fffffffffffffdb8;
      location_06._6_2_ = in_stack_fffffffffffffd96;
      location_06._0_6_ = in_stack_fffffffffffffd90;
      Token((Token *)CONCAT26(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88),
            (BumpAllocator *)CONCAT26(local_22,in_stack_fffffffffffffd80),kind_00,trivia_05,
            rawText_05,location_06,in_stack_fffffffffffffdc0);
      local_10 = (undefined2)local_f0;
      uStack_e = (undefined1)((ulong)local_f0 >> 0x10);
      uStack_d = (undefined5)((ulong)local_f0 >> 0x18);
      local_8 = local_e8;
      goto LAB_0054877f;
    }
    if (local_22 == 6) {
      uVar6 = SUB87(local_20,0);
      uVar4 = (undefined1)((ulong)local_20 >> 0x38);
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x54837c);
      base = (LiteralBase)in_stack_fffffffffffffda0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      local_150 = local_18;
      trivia_03._M_ptr._6_2_ = in_stack_fffffffffffffd7e;
      trivia_03._M_ptr._0_6_ = in_stack_fffffffffffffd78;
      trivia_03._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffd80;
      trivia_03._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffd86;
      rawText_03._M_len._6_2_ = in_stack_fffffffffffffd96;
      rawText_03._M_len._0_6_ = in_stack_fffffffffffffd90;
      rawText_03._M_str = in_stack_fffffffffffffd98;
      location_04._6_2_ = local_22;
      location_04._0_6_ = in_stack_fffffffffffffd70;
      Token((Token *)CONCAT17(uVar4,uVar6),
            (BumpAllocator *)
            CONCAT17(in_stack_fffffffffffffd67,
                     CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),
            (TokenKind)((ulong)in_stack_fffffffffffffd58 >> 0x30),trivia_03,rawText_03,location_04,
            base,SUB81((ulong)in_stack_fffffffffffffd58 >> 0x28,0));
      local_10 = (undefined2)local_128;
      uStack_e = (undefined1)((ulong)local_128 >> 0x10);
      uStack_d = (undefined5)((ulong)local_128 >> 0x18);
      local_8 = local_120;
      goto LAB_0054877f;
    }
    if (local_22 == 7) {
      uVar4 = 7;
      uVar5 = 0;
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x548449);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      local_188 = local_18;
      local_189 = 0x80;
      trivia_04._M_ptr._6_2_ = in_stack_fffffffffffffd7e;
      trivia_04._M_ptr._0_6_ = in_stack_fffffffffffffd78;
      trivia_04._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffd80;
      trivia_04._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffd86;
      rawText_04._M_len._6_2_ = in_stack_fffffffffffffd96;
      rawText_04._M_len._0_6_ = in_stack_fffffffffffffd90;
      rawText_04._M_str = in_stack_fffffffffffffd98;
      location_05._6_2_ = in_stack_fffffffffffffd76;
      location_05._0_6_ = in_stack_fffffffffffffd70;
      Token((Token *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_fffffffffffffd60)),local_20,
            in_stack_fffffffffffffd56,trivia_04,rawText_04,location_05,in_stack_fffffffffffffd6f);
      local_10 = (undefined2)local_160;
      uStack_e = (undefined1)((ulong)local_160 >> 0x10);
      uStack_d = (undefined5)((ulong)local_160 >> 0x18);
      local_8 = local_158;
      goto LAB_0054877f;
    }
    if (local_22 == 8) {
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x54851f);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      local_1c8 = local_18;
      std::optional<slang::TimeUnit>::optional(&local_1ca);
      trivia_06._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffda0;
      trivia_06._M_ptr = (pointer)in_stack_fffffffffffffd98;
      trivia_06._M_extent._M_extent_value._4_2_ = in_stack_fffffffffffffda4;
      trivia_06._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffda6;
      rawText_06._M_len._4_2_ = in_stack_fffffffffffffdb4;
      rawText_06._M_len._0_4_ = in_stack_fffffffffffffdb0;
      rawText_06._M_len._6_2_ = local_22;
      rawText_06._M_str = in_stack_fffffffffffffdb8;
      location_07._6_2_ = in_stack_fffffffffffffd96;
      location_07._0_6_ = in_stack_fffffffffffffd90;
      Token((Token *)CONCAT26(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80),
            (BumpAllocator *)CONCAT26(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78),
            in_stack_fffffffffffffd76,trivia_06,rawText_06,location_07,
            (double)CONCAT17(in_stack_fffffffffffffd6f.value,in_stack_fffffffffffffd68),
            (bool)in_stack_fffffffffffffd67,(optional<slang::TimeUnit>)in_stack_fffffffffffffd8e);
      local_10 = (undefined2)local_1a0;
      uStack_e = (undefined1)((ulong)local_1a0 >> 0x10);
      uStack_d = (undefined5)((ulong)local_1a0 >> 0x18);
      local_8 = local_198;
      goto LAB_0054877f;
    }
    if (local_22 == 9) {
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x548600);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      std::optional<slang::TimeUnit>::optional<slang::TimeUnit,_true>
                ((optional<slang::TimeUnit> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      trivia_07._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffda0;
      trivia_07._M_ptr = (pointer)in_stack_fffffffffffffd98;
      trivia_07._M_extent._M_extent_value._4_2_ = in_stack_fffffffffffffda4;
      trivia_07._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffda6;
      rawText_07._M_len._4_2_ = in_stack_fffffffffffffdb4;
      rawText_07._M_len._0_4_ = in_stack_fffffffffffffdb0;
      rawText_07._M_len._6_2_ = local_22;
      rawText_07._M_str = in_stack_fffffffffffffdb8;
      location_08._6_2_ = in_stack_fffffffffffffd96;
      location_08._0_6_ = in_stack_fffffffffffffd90;
      Token((Token *)CONCAT26(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80),
            (BumpAllocator *)CONCAT26(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78),
            in_stack_fffffffffffffd76,trivia_07,rawText_07,location_08,
            (double)CONCAT17(in_stack_fffffffffffffd6f.value,in_stack_fffffffffffffd68),
            (bool)in_stack_fffffffffffffd67,(optional<slang::TimeUnit>)in_stack_fffffffffffffd8e);
      local_10 = (undefined2)local_1e0;
      uStack_e = (undefined1)((ulong)local_1e0 >> 0x10);
      uStack_d = (undefined5)((ulong)local_1e0 >> 0x18);
      local_8 = local_1d8;
      goto LAB_0054877f;
    }
    if (local_22 != 0x157) {
      if (local_22 == 0x158) goto LAB_00547ffa;
      if (local_22 != 0x159) {
        std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                  ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x5486f1);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        trivia._M_ptr._7_1_ = in_stack_fffffffffffffd6f.value;
        trivia._M_ptr._0_7_ = in_stack_fffffffffffffd68;
        trivia._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffd70;
        trivia._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffd76;
        rawText._M_len._6_2_ = in_stack_fffffffffffffd86;
        rawText._M_len._0_6_ = in_stack_fffffffffffffd80;
        rawText._M_str._0_6_ = in_stack_fffffffffffffd88;
        rawText._M_str._6_2_ = in_stack_fffffffffffffd8e;
        location_00._6_1_ = in_stack_fffffffffffffd66;
        location_00._0_6_ = in_stack_fffffffffffffd60;
        location_00._7_1_ = in_stack_fffffffffffffd67;
        Token(in_stack_fffffffffffffd58,
              (BumpAllocator *)CONCAT26(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50),TVar3,
              trivia,rawText,location_00);
        local_10 = (undefined2)local_220;
        uStack_e = (undefined1)((ulong)local_220 >> 0x10);
        uStack_d = (undefined5)((ulong)local_220 >> 0x18);
        local_8 = local_218;
        goto LAB_0054877f;
      }
    }
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x54811a);
    TVar3 = (TokenKind)((ulong)in_stack_fffffffffffffd58 >> 0x30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_a8 = local_18;
    trivia_01._M_ptr._6_2_ = in_stack_fffffffffffffd7e;
    trivia_01._M_ptr._0_6_ = in_stack_fffffffffffffd78;
    trivia_01._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffd80;
    trivia_01._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffd86;
    rawText_01._M_len._6_2_ = in_stack_fffffffffffffd96;
    rawText_01._M_len._0_6_ = in_stack_fffffffffffffd90;
    rawText_01._M_str = (char *)local_20;
    location_02._6_2_ = in_stack_fffffffffffffd76;
    location_02._0_6_ = in_stack_fffffffffffffd70;
    Token((Token *)CONCAT17(in_stack_fffffffffffffd6f.value,in_stack_fffffffffffffd68),
          (BumpAllocator *)
          CONCAT17(in_stack_fffffffffffffd67,
                   CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),TVar3,trivia_01,
          rawText_01,location_02,in_stack_fffffffffffffda0);
    local_10 = (undefined2)local_80;
    uStack_e = (undefined1)((ulong)local_80 >> 0x10);
    uStack_d = (undefined5)((ulong)local_80 >> 0x18);
    local_8 = local_78;
  }
LAB_0054877f:
  uVar2 = CONCAT53(uStack_d,CONCAT12(uStack_e,local_10)) | 0x10000;
  TVar1.info = local_8;
  TVar1.kind = (short)uVar2;
  TVar1._2_1_ = (char)(uVar2 >> 0x10);
  TVar1.numFlags.raw = (char)(uVar2 >> 0x18);
  TVar1.rawLen = (int)(uVar2 >> 0x20);
  return TVar1;
}

Assistant:

Token Token::createMissing(BumpAllocator& alloc, TokenKind kind, SourceLocation location) {
    Token result;
    switch (kind) {
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
            result = Token(alloc, kind, {}, "", location, "");
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            result = Token(alloc, kind, {}, "", location, SyntaxKind::Unknown);
            break;
        case TokenKind::SystemIdentifier:
            result = Token(alloc, kind, {}, "", location, KnownSystemName::Unknown);
            break;
        case TokenKind::IntegerLiteral:
            result = Token(alloc, kind, {}, "", location, SVInt::Zero);
            break;
        case TokenKind::IntegerBase:
            result = Token(alloc, kind, {}, "", location, LiteralBase::Decimal, false);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            result = Token(alloc, kind, {}, "", location, logic_t::x);
            break;
        case TokenKind::RealLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, std::nullopt);
            break;
        case TokenKind::TimeLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, TimeUnit::Seconds);
            break;
        default:
            result = Token(alloc, kind, {}, "", location);
            break;
    }

    result.missing = true;
    return result;
}